

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O1

int compression_code_lzma(archive *a,la_zstream *lastrm,la_zaction action)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint64_t uVar5;
  uint uVar6;
  long lVar7;
  
  puVar1 = (undefined8 *)lastrm->real_stream;
  *puVar1 = lastrm->next_in;
  uVar5 = lastrm->total_in;
  puVar1[1] = lastrm->avail_in;
  puVar1[2] = uVar5;
  puVar1[3] = lastrm->next_out;
  uVar2 = *(undefined4 *)((long)&lastrm->avail_out + 4);
  uVar5 = lastrm->total_out;
  uVar3 = *(undefined4 *)((long)&lastrm->total_out + 4);
  *(int *)(puVar1 + 4) = (int)lastrm->avail_out;
  *(undefined4 *)((long)puVar1 + 0x24) = uVar2;
  *(int *)(puVar1 + 5) = (int)uVar5;
  *(undefined4 *)((long)puVar1 + 0x2c) = uVar3;
  uVar6 = lzma_code(puVar1,(action == ARCHIVE_Z_FINISH) * '\x03');
  lastrm->next_in = (uint8_t *)*puVar1;
  uVar5 = puVar1[2];
  lastrm->avail_in = puVar1[1];
  lastrm->total_in = uVar5;
  lastrm->next_out = (uint8_t *)puVar1[3];
  uVar2 = *(undefined4 *)((long)puVar1 + 0x24);
  uVar3 = *(undefined4 *)(puVar1 + 5);
  uVar4 = *(undefined4 *)((long)puVar1 + 0x2c);
  *(undefined4 *)&lastrm->avail_out = *(undefined4 *)(puVar1 + 4);
  *(undefined4 *)((long)&lastrm->avail_out + 4) = uVar2;
  *(undefined4 *)&lastrm->total_out = uVar3;
  *(undefined4 *)((long)&lastrm->total_out + 4) = uVar4;
  if (1 < uVar6) {
    if (uVar6 == 6) {
      lVar7 = lzma_memusage(puVar1);
      archive_set_error(a,0xc,"lzma compression error: %ju MiB would have been needed",
                        lVar7 + 0xfffffU >> 0x14);
    }
    else {
      archive_set_error(a,-1,"lzma compression failed: lzma_code() call returned status %d",
                        (ulong)uVar6);
    }
    uVar6 = 0xffffffe2;
  }
  return uVar6;
}

Assistant:

static int
compression_code_lzma(struct archive *a,
    struct la_zstream *lastrm, enum la_zaction action)
{
	lzma_stream *strm;
	int r;

	strm = (lzma_stream *)lastrm->real_stream;
	strm->next_in = lastrm->next_in;
	strm->avail_in = lastrm->avail_in;
	strm->total_in = lastrm->total_in;
	strm->next_out = lastrm->next_out;
	strm->avail_out = lastrm->avail_out;
	strm->total_out = lastrm->total_out;
	r = lzma_code(strm,
	    (action == ARCHIVE_Z_FINISH)? LZMA_FINISH: LZMA_RUN);
	lastrm->next_in = strm->next_in;
	lastrm->avail_in = strm->avail_in;
	lastrm->total_in = strm->total_in;
	lastrm->next_out = strm->next_out;
	lastrm->avail_out = strm->avail_out;
	lastrm->total_out = strm->total_out;
	switch (r) {
	case LZMA_OK:
		/* Non-finishing case */
		return (ARCHIVE_OK);
	case LZMA_STREAM_END:
		/* This return can only occur in finishing case. */
		return (ARCHIVE_EOF);
	case LZMA_MEMLIMIT_ERROR:
		archive_set_error(a, ENOMEM,
		    "lzma compression error:"
		    " %ju MiB would have been needed",
		    (uintmax_t)((lzma_memusage(strm) + 1024 * 1024 -1)
			/ (1024 * 1024)));
		return (ARCHIVE_FATAL);
	default:
		/* Any other return value indicates an error */
		archive_set_error(a, ARCHIVE_ERRNO_MISC,
		    "lzma compression failed:"
		    " lzma_code() call returned status %d", r);
		return (ARCHIVE_FATAL);
	}
}